

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O2

int dlep_session_update_extensions
              (dlep_session *session,uint8_t *extvalues,size_t extcount,_Bool radio)

{
  size_t *psVar1;
  long lVar2;
  ushort uVar3;
  int iVar4;
  ulong in_RAX;
  size_t sVar5;
  avl_tree *tree;
  avl_node *paVar6;
  ulong uVar7;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if ((log_global_mask[session->log_source] & 2) != 0) {
    oonf_log(LOG_SEVERITY_INFO,session->log_source,"src/generic/dlep/dlep_session.c",0xef,
             (void *)0x0,0,"Update session extension list");
  }
  uVar7 = 3;
  do {
    if ((session->parser).extension_count <= uVar7) {
      (session->parser).extension_count = 3;
      for (sVar5 = 0; extcount != sVar5; sVar5 = sVar5 + 1) {
        uVar3 = *(ushort *)(extvalues + sVar5 * 2) << 8 | *(ushort *)(extvalues + sVar5 * 2) >> 8;
        uStack_38 = (ulong)CONCAT24(uVar3,(undefined4)uStack_38);
        tree = dlep_extension_get_tree();
        paVar6 = avl_find(tree,(void *)((long)&uStack_38 + 4));
        if (paVar6 != (avl_node *)0x0) {
          if ((log_global_mask[session->log_source] & 2) != 0) {
            oonf_log(LOG_SEVERITY_INFO,session->log_source,"src/generic/dlep/dlep_session.c",0x10e,
                     (void *)0x0,0,"Add extension: %d",(ulong)uVar3);
          }
          (session->parser).extensions[(session->parser).extension_count] =
               (dlep_extension *)&paVar6[-3].left;
          psVar1 = &(session->parser).extension_count;
          *psVar1 = *psVar1 + 1;
        }
      }
      iVar4 = _update_allowed_tlvs(session);
      return iVar4;
    }
    sVar5 = 0;
    do {
      if (extcount == sVar5) {
        (*(&(session->parser).extensions[uVar7]->cb_session_deactivate_radio)[(ulong)radio ^ 1])
                  (session);
        break;
      }
      lVar2 = sVar5 * 2;
      sVar5 = sVar5 + 1;
    } while ((session->parser).extensions[uVar7]->id !=
             (uint)(ushort)(*(ushort *)(extvalues + lVar2) << 8 |
                           *(ushort *)(extvalues + lVar2) >> 8));
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

int
dlep_session_update_extensions(struct dlep_session *session, const uint8_t *extvalues, size_t extcount, bool radio) {
  struct dlep_extension *ext;
  size_t i, j;
  bool deactivate;
  uint16_t extid;
  OONF_INFO(session->log_source, "Update session extension list");

  /* deactivate all extensions not present anymore  */
  for (j = DLEP_EXTENSION_BASE_COUNT; j < session->parser.extension_count; j++) {
    deactivate = true;

    for (i = 0; i < extcount; i++) {
      memcpy(&extid, &extvalues[i * 2], sizeof(extid));
      if (ntohs(extid) == session->parser.extensions[j]->id) {
        deactivate = false;
        break;
      }
    }

    if (deactivate) {
      if (radio) {
        session->parser.extensions[j]->cb_session_deactivate_radio(session);
      }
      else {
        session->parser.extensions[j]->cb_session_deactivate_router(session);
      }
    }
  }

  /* generate new session extension list */
  session->parser.extension_count = DLEP_EXTENSION_BASE_COUNT;
  for (i = 0; i < extcount; i++) {
    memcpy(&extid, &extvalues[i * 2], sizeof(extid));

    ext = dlep_extension_get(ntohs(extid));
    if (ext) {
      OONF_INFO(session->log_source, "Add extension: %d", ntohs(extid));

      session->parser.extensions[session->parser.extension_count] = ext;
      session->parser.extension_count++;
    }
  }
  return _update_allowed_tlvs(session);
}